

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int tinyexr::DecodeChunk
              (EXRImage *exr_image,EXRHeader *exr_header,
              vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *offsets,uchar *head)

{
  uchar *data_ptr;
  int iVar1;
  int compression_type;
  int line_order;
  int x_stride;
  int height;
  int iVar2;
  int iVar3;
  pointer puVar4;
  pointer puVar5;
  EXRChannelInfo *pEVar6;
  EXRAttribute *attributes;
  int *piVar7;
  int width;
  int num_lines;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  int extraout_EAX;
  int num_channels;
  EXRTile *pEVar11;
  uchar **ppuVar12;
  int iVar13;
  unsigned_long uVar14;
  size_type sVar15;
  size_t y_idx;
  int *piVar16;
  long lVar17;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar18;
  int iVar19;
  ulong pixel_data_size;
  uint uVar20;
  long lVar21;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar22;
  int data_width;
  size_type __new_size;
  undefined4 in_stack_ffffffffffffff38;
  int local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  
  num_channels = exr_header->num_channels;
  iVar10 = exr_header->compression_type;
  __new_size = (size_type)num_channels;
  local_b8 = 0x10;
  if ((iVar10 != 3) && (iVar10 != 0x80)) {
    if (iVar10 == 4) {
      local_b8 = 0x20;
    }
    else {
      local_b8 = 1;
    }
  }
  iVar10 = exr_header->data_window[2] - exr_header->data_window[0];
  iVar13 = exr_header->data_window[3] - exr_header->data_window[1];
  puVar4 = (offsets->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  puVar5 = (offsets->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
           _M_impl.super__Vector_impl_data._M_start;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar6 = exr_header->channels;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&channel_offset_list,__new_size);
  pixel_data_size = 0;
  if (num_channels != 0) {
    piVar16 = &pEVar6->pixel_type;
    uVar14 = 0;
    sVar15 = 0;
    do {
      channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[sVar15] = uVar14;
      iVar19 = *piVar16;
      if ((iVar19 == 0) || (iVar19 == 2)) {
        pixel_data_size = (ulong)((int)pixel_data_size + 4);
        uVar14 = uVar14 + 4;
      }
      else if (iVar19 == 1) {
        pixel_data_size = (ulong)((int)pixel_data_size + 2);
        uVar14 = uVar14 + 2;
      }
      sVar15 = sVar15 + 1;
      piVar16 = piVar16 + 0x44;
    } while (__new_size != sVar15);
    pixel_data_size = (ulong)(int)pixel_data_size;
  }
  data_width = iVar10 + 1;
  iVar19 = iVar13 + 1;
  if (exr_header->tiled == 0) {
    ppuVar12 = AllocateImage(num_channels,exr_header->channels,exr_header->requested_pixel_types,
                             data_width,iVar19);
    exr_image->images = ppuVar12;
    uVar20 = (uint)((ulong)((long)puVar4 - (long)puVar5) >> 3);
    if (0 < (int)uVar20) {
      pvVar22 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                (ulong)(uVar20 & 0x7fffffff);
      pvVar18 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      do {
        piVar16 = (int *)(head + (offsets->
                                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                 )._M_impl.super__Vector_impl_data._M_start[(long)pvVar18]);
        iVar10 = *piVar16;
        iVar13 = exr_header->data_window[3] + 1;
        if (local_b8 + iVar10 <= iVar13) {
          iVar13 = local_b8 + iVar10;
        }
        DecodePixelData(exr_image->images,exr_header->requested_pixel_types,(uchar *)(piVar16 + 2),
                        (long)piVar16[1],exr_header->compression_type,exr_header->line_order,
                        data_width,iVar19,data_width,(int)pvVar18,
                        iVar10 - exr_header->data_window[1],iVar13 - iVar10,pixel_data_size,
                        (long)exr_header->num_channels,(EXRAttribute *)exr_header->channels,
                        (size_t)&channel_offset_list,
                        (EXRChannelInfo *)CONCAT44(num_channels,in_stack_ffffffffffffff38),pvVar22);
        pvVar18 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  ((long)&(pvVar18->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start + 1);
      } while (pvVar22 != pvVar18);
    }
  }
  else {
    puVar4 = (offsets->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    puVar5 = (offsets->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pEVar11 = (EXRTile *)malloc(((long)puVar4 - (long)puVar5) * 4);
    exr_image->tiles = pEVar11;
    lVar21 = (long)puVar4 - (long)puVar5;
    if (lVar21 != 0) {
      lVar21 = lVar21 >> 3;
      pvVar22 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                (lVar21 + (ulong)(lVar21 == 0));
      lVar17 = 0;
      do {
        ppuVar12 = AllocateImage(num_channels,exr_header->channels,exr_header->requested_pixel_types
                                 ,data_width,iVar19);
        pEVar11 = exr_image->tiles;
        *(uchar ***)((long)&pEVar11->images + lVar17 * 4) = ppuVar12;
        data_ptr = head + *(long *)((long)(offsets->
                                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                          )._M_impl.super__Vector_impl_data._M_start + lVar17) +
                          0x14;
        uVar8 = *(undefined8 *)(data_ptr + -0x14);
        uVar9 = *(undefined8 *)(data_ptr + -0xc);
        iVar1 = *(int *)(data_ptr + -4);
        piVar16 = exr_header->requested_pixel_types;
        compression_type = exr_header->compression_type;
        line_order = exr_header->line_order;
        x_stride = exr_header->tile_size_x;
        height = exr_header->tile_size_y;
        iVar2 = *(int *)(data_ptr + -0x10);
        width = data_width - *(int *)(data_ptr + -0x14) * x_stride;
        if ((*(int *)(data_ptr + -0x14) + 1) * x_stride <= iVar10) {
          width = x_stride;
        }
        iVar3 = exr_header->num_channels;
        attributes = (EXRAttribute *)exr_header->channels;
        (&pEVar11->width)[lVar17] = width;
        num_lines = iVar19 - iVar2 * height;
        if ((iVar2 + 1) * height <= iVar13) {
          num_lines = height;
        }
        (&pEVar11->height)[lVar17] = num_lines;
        DecodePixelData(ppuVar12,piVar16,data_ptr,(long)iVar1,compression_type,line_order,width,
                        height,x_stride,0,0,num_lines,pixel_data_size,(long)iVar3,attributes,
                        (size_t)&channel_offset_list,
                        (EXRChannelInfo *)CONCAT44(num_channels,in_stack_ffffffffffffff38),pvVar22);
        piVar16 = &exr_image->tiles->offset_x + lVar17;
        *(undefined8 *)piVar16 = uVar8;
        *(undefined8 *)(piVar16 + 2) = uVar9;
        exr_image->num_tiles = (int)lVar21;
        lVar17 = lVar17 + 8;
        pvVar22 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  ((long)&pvVar22[-1].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 7);
      } while (pvVar22 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0);
    }
  }
  if (0 < exr_header->num_channels) {
    piVar16 = exr_header->pixel_types;
    piVar7 = exr_header->requested_pixel_types;
    lVar21 = 0;
    do {
      piVar16[lVar21] = piVar7[lVar21];
      lVar21 = lVar21 + 1;
    } while (lVar21 < exr_header->num_channels);
  }
  exr_image->num_channels = num_channels;
  exr_image->width = data_width;
  exr_image->height = iVar19;
  if (channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(channel_offset_list.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)channel_offset_list.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)channel_offset_list.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
    num_channels = extraout_EAX;
  }
  return num_channels;
}

Assistant:

static int DecodeChunk(EXRImage *exr_image, const EXRHeader *exr_header,
                       const std::vector<unsigned long long> &offsets,
                       const unsigned char *head) {
  int num_channels = exr_header->num_channels;

  int num_scanline_blocks = 1;
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    num_scanline_blocks = 16;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    num_scanline_blocks = 32;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    num_scanline_blocks = 16;
  }

  int data_width = exr_header->data_window[2] - exr_header->data_window[0] + 1;
  int data_height = exr_header->data_window[3] - exr_header->data_window[1] + 1;

  size_t num_blocks = offsets.size();

  std::vector<size_t> channel_offset_list;
  int pixel_data_size = 0;
  size_t channel_offset = 0;
  tinyexr::ComputeChannelLayout(&channel_offset_list, &pixel_data_size,
                                &channel_offset, num_channels,
                                exr_header->channels);

  if (exr_header->tiled) {
    size_t num_tiles = offsets.size();  // = # of blocks

    exr_image->tiles = static_cast<EXRTile *>(
        malloc(sizeof(EXRTile) * static_cast<size_t>(num_tiles)));

    for (size_t tile_idx = 0; tile_idx < num_tiles; tile_idx++) {
      // Allocate memory for each tile.
      exr_image->tiles[tile_idx].images = tinyexr::AllocateImage(
          num_channels, exr_header->channels, exr_header->requested_pixel_types,
          data_width, data_height);

      // 16 byte: tile coordinates
      // 4 byte : data size
      // ~      : data(uncompressed or compressed)
      const unsigned char *data_ptr =
          reinterpret_cast<const unsigned char *>(head + offsets[tile_idx]);

      int tile_coordinates[4];
      memcpy(tile_coordinates, data_ptr, sizeof(int) * 4);
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&tile_coordinates[0]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&tile_coordinates[1]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&tile_coordinates[2]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&tile_coordinates[3]));

      // @todo{ LoD }
      assert(tile_coordinates[2] == 0);
      assert(tile_coordinates[3] == 0);

      int data_len;
      memcpy(&data_len, data_ptr + 16,
             sizeof(int));  // 16 = sizeof(tile_coordinates)
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));
      assert(data_len >= 4);

      // Move to data addr: 20 = 16 + 4;
      data_ptr += 20;

      tinyexr::DecodeTiledPixelData(
          exr_image->tiles[tile_idx].images,
          &(exr_image->tiles[tile_idx].width),
          &(exr_image->tiles[tile_idx].height),
          exr_header->requested_pixel_types, data_ptr,
          static_cast<size_t>(data_len), exr_header->compression_type,
          exr_header->line_order, data_width, data_height, tile_coordinates[0],
          tile_coordinates[1], exr_header->tile_size_x, exr_header->tile_size_y,
          static_cast<size_t>(pixel_data_size),
          static_cast<int>(exr_header->num_custom_attributes),
          exr_header->custom_attributes,
          static_cast<size_t>(exr_header->num_channels), exr_header->channels,
          channel_offset_list);

      exr_image->tiles[tile_idx].offset_x = tile_coordinates[0];
      exr_image->tiles[tile_idx].offset_y = tile_coordinates[1];
      exr_image->tiles[tile_idx].level_x = tile_coordinates[2];
      exr_image->tiles[tile_idx].level_y = tile_coordinates[3];

      exr_image->num_tiles = static_cast<int>(num_tiles);
    }
  } else {  // scanline format

    exr_image->images = tinyexr::AllocateImage(
        num_channels, exr_header->channels, exr_header->requested_pixel_types,
        data_width, data_height);

#ifdef _OPENMP
#pragma omp parallel for
#endif
    for (int y = 0; y < static_cast<int>(num_blocks); y++) {
      size_t y_idx = static_cast<size_t>(y);
      const unsigned char *data_ptr =
          reinterpret_cast<const unsigned char *>(head + offsets[y_idx]);
      // 4 byte: scan line
      // 4 byte: data size
      // ~     : pixel data(uncompressed or compressed)
      int line_no;
      memcpy(&line_no, data_ptr, sizeof(int));
      int data_len;
      memcpy(&data_len, data_ptr + 4, sizeof(int));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&line_no));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

      int end_line_no = (std::min)(line_no + num_scanline_blocks,
                                   (exr_header->data_window[3] + 1));

      int num_lines = end_line_no - line_no;
      assert(num_lines > 0);

      // printf("num_blocks = %lu, y = %d, lineno = %d, end_line_no = %d,
      // num_lines = %d, data_len = %d\n", num_blocks, y, line_no, end_line_no,
      // num_lines, data_len);

      // Move to data addr: 8 = 4 + 4;
      data_ptr += 8;

      // Adjust line_no with data_window.bmin.y
      line_no -= exr_header->data_window[1];

      tinyexr::DecodePixelData(
          exr_image->images, exr_header->requested_pixel_types, data_ptr,
          static_cast<size_t>(data_len), exr_header->compression_type,
          exr_header->line_order, data_width, data_height, data_width, y,
          line_no, num_lines, static_cast<size_t>(pixel_data_size),
          static_cast<int>(exr_header->num_custom_attributes),
          exr_header->custom_attributes,
          static_cast<size_t>(exr_header->num_channels), exr_header->channels,
          channel_offset_list);
    }  // omp parallel
  }

  // Overwrite `pixel_type` with `requested_pixel_type`.
  {
    for (int c = 0; c < exr_header->num_channels; c++) {
      exr_header->pixel_types[c] = exr_header->requested_pixel_types[c];
    }
  }

  {
    exr_image->num_channels = num_channels;

    exr_image->width = data_width;
    exr_image->height = data_height;
  }

  return TINYEXR_SUCCESS;
}